

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-test.cc
# Opt level: O2

void __thiscall
OptionTest_BuildOptionList_Test::~OptionTest_BuildOptionList_Test
          (OptionTest_BuildOptionList_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OptionTest, BuildOptionList) {
  mp::OptionList options;
  testing::StrictMock<MockHandler> handler;
  mp::OptionList::Builder<MockHandler> builder(options, handler);
  builder.Add<&MockHandler::OnOption1>('a', "test option 1");
  builder.Add<&MockHandler::OnOption2>('b', "test option 2");
  mp::OptionList::iterator i = options.begin();
  EXPECT_OPTION(*i, 'a', "test option 1", &handler);
  EXPECT_CALL(handler, OnOption1());
  i->on_option(i->handler);
  ++i;
  EXPECT_OPTION(*i, 'b', "test option 2", &handler);
  EXPECT_CALL(handler, OnOption2());
  i->on_option(i->handler);
  ++i;
  EXPECT_EQ(i, options.end());
}